

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

uchar lha_calcsum(uchar sum,void *pp,wchar_t offset,size_t size)

{
  char *local_30;
  uchar *p;
  size_t size_local;
  wchar_t offset_local;
  void *pp_local;
  uchar sum_local;
  
  local_30 = (char *)((long)pp + (long)offset);
  pp_local._7_1_ = sum;
  for (p = (uchar *)size; p != (uchar *)0x0; p = p + -1) {
    pp_local._7_1_ = pp_local._7_1_ + *local_30;
    local_30 = local_30 + 1;
  }
  return pp_local._7_1_;
}

Assistant:

static unsigned char
lha_calcsum(unsigned char sum, const void *pp, int offset, size_t size)
{
	unsigned char const *p = (unsigned char const *)pp;

	p += offset;
	for (;size > 0; --size)
		sum += *p++;
	return (sum);
}